

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gain_interpolator.hpp
# Opt level: O0

size_t __thiscall
ear::dsp::GainInterpolator<ear::dsp::LinearInterpVector>::find_block
          (GainInterpolator<ear::dsp::LinearInterpVector> *this,SampleIndex sample_idx)

{
  ulong uVar1;
  size_type sVar2;
  invalid_argument *this_00;
  allocator<char> local_41;
  string local_40;
  int local_20;
  int local_1c;
  int first_cmp;
  int cmp;
  SampleIndex sample_idx_local;
  GainInterpolator<ear::dsp::LinearInterpVector> *this_local;
  
  uVar1 = this->last_block;
  _first_cmp = sample_idx;
  sample_idx_local = (SampleIndex)this;
  sVar2 = std::
          vector<std::pair<long,_std::vector<float,_std::allocator<float>_>_>,_std::allocator<std::pair<long,_std::vector<float,_std::allocator<float>_>_>_>_>
          ::size(&this->interp_points);
  if (sVar2 < uVar1) {
    this->last_block = 0;
  }
  local_20 = block_cmp(this,this->last_block,_first_cmp);
  local_1c = local_20;
  while( true ) {
    if (local_1c == 0) {
      return this->last_block;
    }
    this->last_block = (long)local_1c + this->last_block;
    if (local_1c != local_20) break;
    local_1c = block_cmp(this,this->last_block,_first_cmp);
  }
  this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,"interpolation points are not sorted",&local_41);
  invalid_argument::invalid_argument(this_00,&local_40);
  __cxa_throw(this_00,&invalid_argument::typeinfo,invalid_argument::~invalid_argument);
}

Assistant:

size_t find_block(SampleIndex sample_idx) {
        // last_block could be outside the allowed range if interp_points
        // changed since the last call
        if (last_block > interp_points.size()) last_block = 0;

        // move in the direction given by block_cmp until we find the right
        // block (cmp == 0); this is slightly complicated by checking that we
        // are making progress.
        int cmp = block_cmp(last_block, sample_idx);
        int first_cmp = cmp;
        while (cmp != 0) {
          last_block += cmp;
          if (cmp != first_cmp)
            throw invalid_argument("interpolation points are not sorted");
          cmp = block_cmp(last_block, sample_idx);
        }

        return last_block;
      }